

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

S1Interval __thiscall S1Interval::Intersection(S1Interval *this,S1Interval *y)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S1Interval SVar9;
  S2LogMessage SStack_18;
  
  dVar3 = (y->bounds_).c_[0];
  dVar7 = (y->bounds_).c_[1];
  dVar6 = 3.141592653589793;
  dVar5 = -3.141592653589793;
  if ((((dVar3 != 3.141592653589793) || (NAN(dVar3))) || (dVar7 != -3.141592653589793)) ||
     (NAN(dVar7))) {
    dVar6 = (this->bounds_).c_[0];
    dVar5 = (this->bounds_).c_[1];
    dVar4 = dVar7;
    if (dVar6 <= dVar5) {
      if ((dVar6 <= dVar3) && (dVar3 <= dVar5)) {
        if (dVar6 <= dVar7) goto LAB_0019ca27;
LAB_0019caa2:
        if (((ABS(dVar3) <= 3.141592653589793) && (ABS(dVar5) <= 3.141592653589793)) &&
           ((dVar3 != -3.141592653589793 || dVar5 == 3.141592653589793 &&
            (dVar4 = dVar5, dVar3 == 3.141592653589793 || dVar5 != -3.141592653589793))))
        goto LAB_0019cb5c;
        S2LogMessage::S2LogMessage
                  (&SStack_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_18.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019cb9a;
      }
      bVar1 = true;
      if (dVar6 <= dVar7) {
        if (dVar7 <= dVar5) goto LAB_0019c9b4;
        bVar1 = false;
      }
    }
    else {
      if (((dVar6 <= dVar3) || (dVar3 <= dVar5)) &&
         ((dVar6 != 3.141592653589793 ||
          (((NAN(dVar6) || (dVar5 != -3.141592653589793)) || (NAN(dVar5))))))) {
        if (dVar7 < dVar6) {
LAB_0019ca27:
          if (dVar5 < dVar7) goto LAB_0019caa2;
        }
        dVar7 = dVar7 - dVar3;
        if (dVar7 < 0.0) {
          uVar2 = -(ulong)(0.0 < dVar7 + 6.283185307179586);
          dVar7 = (double)((ulong)(dVar7 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000)
          ;
        }
        dVar8 = dVar5 - dVar6;
        if (dVar8 < 0.0) {
          uVar2 = -(ulong)(0.0 < dVar8 + 6.283185307179586);
          dVar8 = (double)((ulong)(dVar8 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000)
          ;
        }
        if (dVar7 < dVar8) goto LAB_0019cb5c;
        goto LAB_0019c850;
      }
      if (((dVar7 >= dVar6) || (bVar1 = true, dVar7 <= dVar5)) &&
         ((dVar6 != 3.141592653589793 ||
          (((NAN(dVar6) || (dVar5 != -3.141592653589793)) || (bVar1 = dVar7 < dVar6, NAN(dVar5))))))
         ) {
LAB_0019c9b4:
        if ((((3.141592653589793 < ABS(dVar7)) || (3.141592653589793 < ABS(dVar6))) ||
            (((dVar7 != 3.141592653589793 || (NAN(dVar7))) &&
             ((dVar6 == -3.141592653589793 && (!NAN(dVar6))))))) ||
           (((dVar3 = dVar6, dVar7 == -3.141592653589793 && (!NAN(dVar7))) &&
            ((dVar6 != 3.141592653589793 || (NAN(dVar6))))))) {
          S2LogMessage::S2LogMessage
                    (&SStack_18,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                     ,0xe4,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_18.stream_,"Check failed: is_valid() ",0x19);
          goto LAB_0019cb9a;
        }
        goto LAB_0019cb5c;
      }
    }
    if (dVar3 <= dVar7) {
      if ((dVar3 <= dVar6) && (dVar3 = dVar6, dVar4 = dVar5, dVar6 <= dVar7)) goto LAB_0019cb5c;
    }
    else if (!(bool)(dVar6 < dVar3 & bVar1)) {
      if ((dVar3 != 3.141592653589793) || (NAN(dVar3))) goto LAB_0019c850;
      dVar3 = dVar6;
      dVar4 = dVar5;
      if ((dVar7 != -3.141592653589793) || (NAN(dVar7))) goto LAB_0019cb5c;
    }
    bVar1 = Intersects(this,y);
    dVar3 = 3.141592653589793;
    dVar4 = -3.141592653589793;
    if (bVar1) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
                 ,0x117,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: !Intersects(y) ",0x1d);
LAB_0019cb9a:
      abort();
    }
  }
  else {
LAB_0019c850:
    dVar3 = dVar6;
    dVar4 = dVar5;
  }
LAB_0019cb5c:
  SVar9.bounds_.c_[1] = dVar4;
  SVar9.bounds_.c_[0] = dVar3;
  return (S1Interval)SVar9.bounds_.c_;
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}